

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BlockingPriorityQueue.hpp
# Opt level: O0

optional<helics::ActionMessage> * __thiscall
gmlc::containers::BlockingPriorityQueue<helics::ActionMessage,_std::mutex,_std::condition_variable>
::try_pop(BlockingPriorityQueue<helics::ActionMessage,_std::mutex,_std::condition_variable> *this)

{
  bool bVar1;
  long in_RSI;
  optional<helics::ActionMessage> *in_RDI;
  optional<helics::ActionMessage> *this_00;
  lock_guard<std::mutex> pullLock;
  optional<helics::ActionMessage> *val;
  ActionMessage *in_stack_ffffffffffffffa8;
  optional<helics::ActionMessage> *in_stack_ffffffffffffffb0;
  optional<helics::ActionMessage> *this_01;
  undefined4 in_stack_ffffffffffffffe0;
  undefined4 in_stack_ffffffffffffffe4;
  
  this_01 = in_RDI;
  std::lock_guard<std::mutex>::lock_guard
            ((lock_guard<std::mutex> *)in_stack_ffffffffffffffb0,
             (mutex_type *)in_stack_ffffffffffffffa8);
  bVar1 = CLI::std::
          queue<helics::ActionMessage,_std::deque<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>_>
          ::empty((queue<helics::ActionMessage,_std::deque<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>_>
                   *)0x53a224);
  if (bVar1) {
    checkPullAndSwap((BlockingPriorityQueue<helics::ActionMessage,_std::mutex,_std::condition_variable>
                      *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0));
    bVar1 = std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>::empty
                      ((vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_> *)
                       this_01);
    if (bVar1) {
      std::optional<helics::ActionMessage>::optional(in_RDI);
    }
    else {
      this_00 = (optional<helics::ActionMessage> *)(in_RSI + 0x68);
      std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>::back
                ((vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_> *)this_00);
      std::optional<helics::ActionMessage>::optional<helics::ActionMessage,_true>
                (this_00,in_stack_ffffffffffffffa8);
      std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>::pop_back
                ((vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_> *)0x53a2f8);
      checkPullAndSwap((BlockingPriorityQueue<helics::ActionMessage,_std::mutex,_std::condition_variable>
                        *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0));
    }
  }
  else {
    CLI::std::
    queue<helics::ActionMessage,_std::deque<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>_>
    ::front((queue<helics::ActionMessage,_std::deque<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>_>
             *)0x53a23e);
    std::optional<helics::ActionMessage>::optional<helics::ActionMessage,_true>
              (in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
    CLI::std::
    queue<helics::ActionMessage,_std::deque<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>_>
    ::pop((queue<helics::ActionMessage,_std::deque<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>_>
           *)0x53a25c);
  }
  std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)0x53a34a);
  return (optional<helics::ActionMessage> *)this_01;
}

Assistant:

std::optional<T> BlockingPriorityQueue<T, MUTEX, COND>::try_pop()
    {
        std::lock_guard<MUTEX> pullLock(m_pullLock);  // first pullLock
        if (!priorityQueue.empty()) {
            std::optional<T> val(std::move(priorityQueue.front()));
            priorityQueue.pop();
            return val;
        }
        checkPullAndSwap();
        if (pullElements.empty()) {
            return std::nullopt;
        }
        // do it this way to allow movable only types
        std::optional<T> val(std::move(pullElements.back()));
        pullElements.pop_back();
        checkPullAndSwap();
        return val;
    }